

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall FloatInstance::FloatInstance(FloatInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  double dVar3;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Float",&local_31);
  Instance::Instance(&this->super_Instance,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__CharacterInstance_0017beb0;
  bVar1 = Grammar::is_float_value(value);
  if (bVar1) {
    dVar3 = atof((value->_M_dataplus)._M_p);
    this->_value = (float)dVar3;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

FloatInstance::FloatInstance(const std::string& value) : Instance("Float") {
    if (!Grammar::is_float_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = atof(value.c_str());
}